

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_get_ddos_config_options.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8e527::Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>::
Json2Array(Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType> *this,
          Value *value,
          vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
          *vec)

{
  iterator __position;
  bool bVar1;
  ArrayIndex AVar2;
  Int IVar3;
  Value *pVVar4;
  Value *this_00;
  uint index;
  YundunGetDdosConfigOptionsRequestThresholdOptionType val;
  YundunGetDdosConfigOptionsRequestThresholdOptionType local_40;
  
  bVar1 = Json::Value::isArray((Value *)this);
  if (bVar1) {
    AVar2 = Json::Value::size((Value *)this);
    if (AVar2 != 0) {
      index = 0;
      do {
        pVVar4 = Json::Value::operator[]((Value *)this,index);
        bVar1 = Json::Value::isMember(pVVar4,"Bps");
        if (bVar1) {
          this_00 = Json::Value::operator[](pVVar4,"Bps");
          IVar3 = Json::Value::asInt(this_00);
          local_40.bps = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(pVVar4,"Pps");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](pVVar4,"Pps");
          IVar3 = Json::Value::asInt(pVVar4);
          local_40.pps = (long)IVar3;
        }
        __position._M_current =
             *(YundunGetDdosConfigOptionsRequestThresholdOptionType **)&value->field_0x8;
        if (__position._M_current ==
            (YundunGetDdosConfigOptionsRequestThresholdOptionType *)value->comments_) {
          std::
          vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>>
          ::_M_realloc_insert<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType_const&>
                    ((vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>>
                      *)value,__position,&local_40);
        }
        else {
          (__position._M_current)->bps = local_40.bps;
          (__position._M_current)->pps = local_40.pps;
          *(long *)&value->field_0x8 = *(long *)&value->field_0x8 + 0x10;
        }
        index = index + 1;
        AVar2 = Json::Value::size((Value *)this);
      } while (index < AVar2);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }